

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O2

void __thiscall ExecutionEngine::i_invokestatic(ExecutionEngine *this)

{
  char cVar1;
  u2 index;
  cp_info *constantPool;
  bool bVar2;
  VMStack *this_00;
  Frame *this_01;
  cp_info **ppcVar3;
  u1 *puVar4;
  ulong uVar5;
  char *pcVar6;
  long lVar7;
  MethodArea *this_02;
  ClassRuntime *classRuntime;
  Frame *this_03;
  Frame *pFVar8;
  ostream *poVar9;
  ushort uVar10;
  uint uVar11;
  ulong uVar12;
  vector<Value,_std::allocator<Value>_> args;
  string methodName;
  Value value;
  string methodDescriptor;
  string className;
  _Vector_base<Value,_std::allocator<Value>_> local_120;
  string local_108;
  string local_e8;
  _Deque_base<Value,_std::allocator<Value>_> local_c8;
  stack<Value,_std::deque<Value,_std::allocator<Value>_>_> operandStackBackup;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  Frame::backupOperandStack(&operandStackBackup,this_01);
  ppcVar3 = Frame::getConstantPool(this_01);
  constantPool = *ppcVar3;
  puVar4 = Frame::getCode(this_01,this_01->pc);
  uVar5 = (ulong)(ushort)(*(ushort *)(puVar4 + 1) << 8 | *(ushort *)(puVar4 + 1) >> 8);
  if (constantPool[uVar5 - 1].tag != '\n') {
    __assert_fail("methodCP.tag == CONSTANT_Methodref",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0x100f,"void ExecutionEngine::i_invokestatic()");
  }
  uVar12 = (ulong)constantPool[uVar5 - 1].info.fieldref_info.name_and_type_index;
  pcVar6 = getFormattedConstant(constantPool,constantPool[uVar5 - 1].info.fieldref_info.class_index)
  ;
  std::__cxx11::string::string((string *)&className,pcVar6,(allocator *)&methodName);
  if (constantPool[uVar12 - 1].tag != '\f') {
    __assert_fail("nameAndTypeCP.tag == CONSTANT_NameAndType",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0x1016,"void ExecutionEngine::i_invokestatic()");
  }
  index = constantPool[uVar12 - 1].info.fieldref_info.name_and_type_index;
  pcVar6 = getFormattedConstant
                     (constantPool,constantPool[uVar12 - 1].info.fieldref_info.class_index);
  std::__cxx11::string::string((string *)&methodName,pcVar6,(allocator *)&methodDescriptor);
  pcVar6 = getFormattedConstant(constantPool,index);
  std::__cxx11::string::string((string *)&methodDescriptor,pcVar6,(allocator *)&args);
  bVar2 = std::operator==(&className,"java/lang/Object");
  if ((!bVar2) || (bVar2 = std::operator==(&methodName,"registerNatives"), !bVar2)) {
    lVar7 = std::__cxx11::string::find((char *)&className,0x129561);
    if (lVar7 != -1) {
      poVar9 = std::operator<<((ostream *)&std::cerr,"Tentando invocar metodo estatico invalido: ");
      poVar9 = std::operator<<(poVar9,(string *)&methodName);
      std::endl<char,std::char_traits<char>>(poVar9);
      exit(1);
    }
    uVar10 = 1;
    uVar11 = 0;
    do {
      cVar1 = methodDescriptor._M_dataplus._M_p[uVar10];
      if ((cVar1 == 'D') || (cVar1 == 'J')) {
        uVar11 = uVar11 + 2;
      }
      else {
        if (cVar1 == 'L') {
          do {
            uVar10 = uVar10 + 1;
          } while (methodDescriptor._M_dataplus._M_p[uVar10] != ';');
        }
        else {
          if (cVar1 == '[') {
            uVar11 = uVar11 + 1;
            do {
              uVar10 = uVar10 + 1;
            } while (methodDescriptor._M_dataplus._M_p[uVar10] == '[');
            if (methodDescriptor._M_dataplus._M_p[uVar10] == 'L') {
              do {
                uVar10 = uVar10 + 1;
              } while (methodDescriptor._M_dataplus._M_p[uVar10] != ';');
            }
            goto LAB_0012252b;
          }
          if (cVar1 == ')') goto LAB_00122551;
        }
        uVar11 = uVar11 + 1;
      }
LAB_0012252b:
      uVar10 = uVar10 + 1;
    } while( true );
  }
LAB_001226b6:
  this_01->pc = this_01->pc + 3;
LAB_001226b9:
  std::__cxx11::string::~string((string *)&methodDescriptor);
  std::__cxx11::string::~string((string *)&methodName);
  std::__cxx11::string::~string((string *)&className);
  std::_Deque_base<Value,_std::allocator<Value>_>::~_Deque_base
            ((_Deque_base<Value,_std::allocator<Value>_> *)&operandStackBackup);
  return;
LAB_00122551:
  args.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  args.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  args.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  uVar11 = uVar11 & 0xffff;
  while (bVar2 = uVar11 != 0, uVar11 = uVar11 - 1, bVar2) {
    value = Frame::popTopOfOperandStack(this_01);
    if (value.type == PADDING) {
      std::vector<Value,_std::allocator<Value>_>::insert
                (&args,args.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.
                       super__Vector_impl_data._M_start + 1,&value);
    }
    else {
      std::vector<Value,_std::allocator<Value>_>::insert
                (&args,(const_iterator)
                       args.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.
                       super__Vector_impl_data._M_start,&value);
    }
  }
  this_02 = MethodArea::getInstance();
  classRuntime = MethodArea::loadClassNamed(this_02,&className);
  this_03 = (Frame *)operator_new(0xb8);
  std::__cxx11::string::string((string *)&local_e8,(string *)&methodName);
  std::__cxx11::string::string((string *)&local_108,(string *)&methodDescriptor);
  std::vector<Value,_std::allocator<Value>_>::vector
            ((vector<Value,_std::allocator<Value>_> *)&local_120,&args);
  Frame::Frame(this_03,classRuntime,&local_e8,&local_108,
               (vector<Value,_std::allocator<Value>_> *)&local_120);
  std::_Vector_base<Value,_std::allocator<Value>_>::~_Vector_base(&local_120);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_e8);
  pFVar8 = VMStack::getTopFrame(this_00);
  if (pFVar8 == this_01) {
    VMStack::addFrame(this_00,this_03);
  }
  else {
    std::deque<Value,_std::allocator<Value>_>::deque
              ((deque<Value,_std::allocator<Value>_> *)&local_c8,&operandStackBackup.c);
    Frame::setOperandStackFromBackup
              (this_01,(stack<Value,_std::deque<Value,_std::allocator<Value>_>_> *)&local_c8);
    std::_Deque_base<Value,_std::allocator<Value>_>::~_Deque_base(&local_c8);
    Frame::~Frame(this_03);
    operator_delete(this_03);
  }
  std::_Vector_base<Value,_std::allocator<Value>_>::~_Vector_base
            (&args.super__Vector_base<Value,_std::allocator<Value>_>);
  if (pFVar8 != this_01) goto LAB_001226b9;
  goto LAB_001226b6;
}

Assistant:

void ExecutionEngine::i_invokestatic() {
    VMStack &stackFrame = VMStack::getInstance();
    Frame *topFrame = stackFrame.getTopFrame();
    
    stack<Value> operandStackBackup = topFrame->backupOperandStack();
    
    cp_info *constantPool = *(topFrame->getConstantPool());
    u1 *code = topFrame->getCode(topFrame->pc);

    u1 byte1 = code[1];
    u1 byte2 = code[2];

    uint16_t methodIndex = (byte1 << 8) | byte2;
    cp_info methodCP = constantPool[methodIndex-1];
    assert(methodCP.tag == CONSTANT_Methodref); // precisa referenciar um método

    CONSTANT_Methodref_info methodInfo = methodCP.info.methodref_info;

    string className = getFormattedConstant(constantPool, methodInfo.class_index);

    cp_info nameAndTypeCP = constantPool[methodInfo.name_and_type_index-1];
    assert(nameAndTypeCP.tag == CONSTANT_NameAndType); // precisa ser um nameAndType

    CONSTANT_NameAndType_info methodNameAndType = nameAndTypeCP.info.nameAndType_info;

    string methodName = getFormattedConstant(constantPool, methodNameAndType.name_index);
    string methodDescriptor = getFormattedConstant(constantPool, methodNameAndType.descriptor_index);

    if (className == "java/lang/Object" && methodName == "registerNatives") {
        topFrame->pc += 3;
        return;
    }
    
    if (className.find("java/") != string::npos) {
        cerr << "Tentando invocar metodo estatico invalido: " << methodName << endl;
        exit(1);
    } else {
        uint16_t nargs = 0; // numero de argumentos contidos na pilha de operandos
        uint16_t i = 1; // pulando o primeiro '('
        while (methodDescriptor[i] != ')') {
            char baseType = methodDescriptor[i];
            if (baseType == 'D' || baseType == 'J') {
                nargs += 2;
            } else if (baseType == 'L') {
                nargs++;
                while (methodDescriptor[++i] != ';');
            } else if (baseType == '[') {
                nargs++;
                while (methodDescriptor[++i] == '[');
                if (methodDescriptor[i] == 'L') while (methodDescriptor[++i] != ';');
            } else {
                nargs++;
            }
            i++;
        }

        vector<Value> args;
        for (int i = 0; i < nargs; i++) {
            Value value = topFrame->popTopOfOperandStack();
            if (value.type == ValueType::PADDING) {
                args.insert(args.begin() + 1, value); // adicionando o padding após o valor double/long.
            } else {
                args.insert(args.begin(), value);
            }
        }

        MethodArea &methodArea = MethodArea::getInstance();
        ClassRuntime *classRuntime = methodArea.loadClassNamed(className);
        Frame *newFrame = new Frame(classRuntime, methodName, methodDescriptor, args);

        // se a stack frame mudou, é porque teve <clinit> adicionado, então terminar a execução da instrução para eles serem executados.
        if (stackFrame.getTopFrame() != topFrame) {
            topFrame->setOperandStackFromBackup(operandStackBackup);
            delete newFrame;
            return;
        }

        stackFrame.addFrame(newFrame);
    }

    topFrame->pc += 3;
}